

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<QLatin1String,_QString> *b)

{
  ArrayOptions *pAVar1;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  char16_t *__src;
  long lVar6;
  long lVar7;
  QChar *pQVar8;
  
  pDVar3 = (a->d).d;
  lVar4 = (a->d).size;
  lVar7 = (b->a).m_size + lVar4 + (b->b).d.size;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar4);
    pDVar3 = (a->d).d;
    if (pDVar3 != (Data *)0x0) goto LAB_0018c193;
    if (0 < lVar7) {
      lVar4 = (a->d).size;
      goto LAB_0018c1e8;
    }
  }
  else {
LAB_0018c193:
    lVar5 = (pDVar3->super_QArrayData).alloc;
    lVar4 = (a->d).size;
    lVar6 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((lVar5 - lVar4) - lVar6 < lVar7) {
      lVar2 = lVar5 * 2;
      if (lVar5 * 2 < lVar7) {
        lVar2 = lVar7;
      }
      lVar7 = lVar2;
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar5 - lVar6 <= lVar7)) {
LAB_0018c1e8:
        if (lVar7 < lVar4) {
          lVar7 = lVar4;
        }
        QString::reallocData((longlong)a,(AllocationOption)lVar7);
        pDVar3 = (a->d).d;
        if (pDVar3 == (Data *)0x0) goto LAB_0018c218;
        lVar5 = (pDVar3->super_QArrayData).alloc;
      }
      if (lVar5 != 0) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_0018c229;
  }
LAB_0018c218:
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_0018c229:
  pQVar8 = (QChar *)((a->d).ptr + (a->d).size);
  lVar4 = (b->a).m_size;
  QAbstractConcatenable::appendLatin1To(b->a,pQVar8);
  lVar7 = (b->b).d.size;
  if (lVar7 != 0) {
    __src = (b->b).d.ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar8 + lVar4,__src,lVar7 * 2);
  }
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}